

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  char **__ptr;
  char **__ptr_00;
  char **__ptr_01;
  char *pcVar5;
  undefined1 auVar6 [16];
  
  ppcVar4 = (char **)realloc(info->itext_keys,info->itext_num * 8 + 8);
  __ptr = (char **)realloc(info->itext_langtags,info->itext_num * 8 + 8);
  __ptr_00 = (char **)realloc(info->itext_transkeys,info->itext_num * 8 + 8);
  __ptr_01 = (char **)realloc(info->itext_strings,info->itext_num * 8 + 8);
  auVar6._0_4_ = -(uint)((int)((ulong)ppcVar4 >> 0x20) == 0 && (int)ppcVar4 == 0);
  auVar6._4_4_ = -(uint)((int)__ptr == 0 && (int)((ulong)__ptr >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar6._12_4_ = -(uint)((int)__ptr_01 == 0 && (int)((ulong)__ptr_01 >> 0x20) == 0);
  iVar2 = movmskps((int)__ptr_01,auVar6);
  if (iVar2 == 0) {
    sVar1 = info->itext_num;
    info->itext_num = sVar1 + 1;
    info->itext_keys = ppcVar4;
    info->itext_langtags = __ptr;
    info->itext_transkeys = __ptr_00;
    info->itext_strings = __ptr_01;
    ppcVar4[sVar1] = (char *)0x0;
    pcVar5 = (char *)malloc(1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      ppcVar4[sVar1] = pcVar5;
    }
    string_set(ppcVar4 + sVar1,key);
    sVar1 = info->itext_num;
    ppcVar4 = info->itext_langtags;
    ppcVar4[sVar1 - 1] = (char *)0x0;
    pcVar5 = (char *)malloc(1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      ppcVar4[sVar1 - 1] = pcVar5;
    }
    string_set(info->itext_langtags + (sVar1 - 1),langtag);
    sVar1 = info->itext_num;
    ppcVar4 = info->itext_transkeys;
    ppcVar4[sVar1 - 1] = (char *)0x0;
    pcVar5 = (char *)malloc(1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      ppcVar4[sVar1 - 1] = pcVar5;
    }
    string_set(info->itext_transkeys + (sVar1 - 1),transkey);
    sVar1 = info->itext_num;
    ppcVar4 = info->itext_strings;
    ppcVar4[sVar1 - 1] = (char *)0x0;
    pcVar5 = (char *)malloc(1);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      ppcVar4[sVar1 - 1] = pcVar5;
    }
    string_set(info->itext_strings + (sVar1 - 1),str);
    uVar3 = 0;
  }
  else {
    free(ppcVar4);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    uVar3 = 0x53;
  }
  return uVar3;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str)
{
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings)
  {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  string_init(&info->itext_keys[info->itext_num - 1]);
  string_set(&info->itext_keys[info->itext_num - 1], key);

  string_init(&info->itext_langtags[info->itext_num - 1]);
  string_set(&info->itext_langtags[info->itext_num - 1], langtag);

  string_init(&info->itext_transkeys[info->itext_num - 1]);
  string_set(&info->itext_transkeys[info->itext_num - 1], transkey);

  string_init(&info->itext_strings[info->itext_num - 1]);
  string_set(&info->itext_strings[info->itext_num - 1], str);

  return 0;
}